

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-impl-test.cc
# Opt level: O0

void __thiscall
FPTest_ComputeBoundariesSubnormal_Test::~FPTest_ComputeBoundariesSubnormal_Test
          (FPTest_ComputeBoundariesSubnormal_Test *this)

{
  void *in_RDI;
  
  ~FPTest_ComputeBoundariesSubnormal_Test((FPTest_ComputeBoundariesSubnormal_Test *)0x11b578);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(FPTest, ComputeBoundariesSubnormal) {
  auto v = fp(0xbeef, 42);
  fp lower, upper;
  v.compute_boundaries(lower, upper);
  EXPECT_EQ(0xbeee800000000000, lower.f);
  EXPECT_EQ(-6, lower.e);
  EXPECT_EQ(0xbeef800000000000, upper.f);
  EXPECT_EQ(-6, upper.e);
}